

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::StartNextTests(cmCTestMultiProcessHandler *this)

{
  uv_timer_ptr *this_00;
  cmCTest *pcVar1;
  unsigned_long uVar2;
  bool bVar3;
  uint uVar4;
  uv_timer_s *puVar5;
  ulong uVar6;
  ulong uVar7;
  mapped_type *ppcVar8;
  size_t sVar9;
  ostream *poVar10;
  uint64_t timeout;
  byte bVar11;
  ulong uVar12;
  undefined8 unaff_RBP;
  pointer __k;
  int *test;
  pointer piVar13;
  double dVar14;
  string local_240;
  uint local_21c;
  uv_timer_ptr *local_218;
  ulong local_210;
  ulong local_208;
  SystemInformation info;
  ulong local_1f8;
  TestList copy;
  string testWithMinProcessors;
  ostringstream cmCTestLog_msg;
  
  this_00 = &this->TestLoadRetryTimer;
  puVar5 = ::cm::uv_handle_ptr_base_<uv_timer_s>::get((uv_handle_ptr_base_<uv_timer_s> *)this_00);
  if (puVar5 != (uv_timer_s *)0x0) {
    puVar5 = ::cm::uv_handle_ptr_::operator_cast_to_uv_timer_s_
                       (&this_00->super_uv_handle_ptr_<uv_timer_s>);
    uv_timer_stop(puVar5);
  }
  if ((this->Tests).
      super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
      ._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    ::cm::uv_handle_ptr_base_<uv_timer_s>::reset((uv_handle_ptr_base_<uv_timer_s> *)this_00);
    return;
  }
  bVar3 = CheckStopTimePassed(this);
  if (!bVar3) {
    local_208 = this->ParallelLevel;
    bVar3 = this->RunningCount <= local_208;
    uVar6 = local_208 - this->RunningCount;
    uVar12 = 0;
    if (bVar3) {
      uVar12 = uVar6;
    }
    if ((bVar3 && uVar6 != 0) && (this->SerialTestRunning == false)) {
      testWithMinProcessors._M_dataplus._M_p = (pointer)&testWithMinProcessors.field_2;
      testWithMinProcessors._M_string_length = 0;
      testWithMinProcessors.field_2._M_local_buf[0] = '\0';
      cmsys::SystemInformation::SystemInformation(&info);
      uVar7 = this->TestLoad;
      bVar3 = uVar7 == 0;
      if (bVar3) {
        local_210 = 0;
        local_1f8 = 0;
      }
      else {
        local_210 = this->FakeLoadForTesting;
        if (local_210 == 0) {
          dVar14 = cmsys::SystemInformation::GetLoadAverage(&info);
          dVar14 = ceil(dVar14);
          local_210 = (long)(dVar14 - 9.223372036854776e+18) & (long)dVar14 >> 0x3f | (long)dVar14;
          uVar7 = this->TestLoad;
        }
        else {
          this->FakeLoadForTesting = 1;
        }
        local_1f8 = 0;
        if (local_210 <= uVar7) {
          local_1f8 = uVar7 - local_210;
        }
        uVar6 = uVar12;
        if (local_1f8 <= uVar12) {
          uVar6 = local_1f8;
        }
      }
      local_21c = (uint)CONCAT71((int7)((ulong)unaff_RBP >> 8),!bVar3);
      local_218 = this_00;
      std::vector<int,_std::allocator<int>_>::vector
                (&copy.super_vector<int,_std::allocator<int>_>,
                 &(this->SortedTests).super_vector<int,_std::allocator<int>_>);
      piVar13 = copy.super_vector<int,_std::allocator<int>_>.
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish;
      __k = copy.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
      while ((__k != piVar13 && (this->SerialTestRunning == false))) {
        ppcVar8 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&(this->Properties).
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,__k);
        if (((*ppcVar8)->RunSerial != true) || (uVar12 = uVar6, this->RunningCount == 0)) {
          sVar9 = GetProcessorsUsed(this,*__k);
          if (this->TestLoad == 0) {
LAB_001abbe9:
            bVar3 = false;
          }
          else {
            bVar3 = true;
            if (sVar9 <= local_1f8) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
              poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"OK to run ");
              GetName_abi_cxx11_(&local_240,this,*__k);
              poVar10 = std::operator<<(poVar10,(string *)&local_240);
              poVar10 = std::operator<<(poVar10,", it requires ");
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
              poVar10 = std::operator<<(poVar10," procs & system load is: ");
              poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
              std::endl<char,std::char_traits<char>>(poVar10);
              std::__cxx11::string::~string((string *)&local_240);
              pcVar1 = this->CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,0,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                           ,0x175,local_240._M_dataplus._M_p,false);
              std::__cxx11::string::~string((string *)&local_240);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
              local_21c = 0;
              goto LAB_001abbe9;
            }
          }
          if (sVar9 <= local_208) {
            GetName_abi_cxx11_((string *)&cmCTestLog_msg,this,*__k);
            std::__cxx11::string::operator=
                      ((string *)&testWithMinProcessors,(string *)&cmCTestLog_msg);
            std::__cxx11::string::~string((string *)&cmCTestLog_msg);
            local_208 = sVar9;
          }
          uVar12 = uVar6 - sVar9;
          if (((bVar3 || uVar6 < sVar9) || (bVar3 = StartTest(this,*__k), !bVar3)) &&
             (uVar12 = uVar6, uVar6 == 0)) break;
        }
        __k = __k + 1;
        uVar6 = uVar12;
      }
      if ((local_21c & 1) != 0) {
        bVar11 = 1;
        for (piVar13 = copy.super_vector<int,_std::allocator<int>_>.
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start;
            piVar13 !=
            copy.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
            piVar13 = piVar13 + 1) {
          ppcVar8 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&(this->Properties).
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,piVar13);
          bVar11 = bVar11 & (*ppcVar8)->RunSerial;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        std::operator<<((ostream *)&cmCTestLog_msg,"***** WAITING, ");
        pcVar1 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x191,local_240._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        if (this->SerialTestRunning == true) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          std::operator<<((ostream *)&cmCTestLog_msg,"Waiting for RUN_SERIAL test to finish.");
          pcVar1 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                       ,0x195,local_240._M_dataplus._M_p,false);
        }
        else if (bVar11 == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"System Load: ");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          poVar10 = std::operator<<(poVar10,", Max Allowed Load: ");
          poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          poVar10 = std::operator<<(poVar10,", Smallest test ");
          poVar10 = std::operator<<(poVar10,(string *)&testWithMinProcessors);
          poVar10 = std::operator<<(poVar10," requires ");
          std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
          pcVar1 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                       ,0x19f,local_240._M_dataplus._M_p,false);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
          std::operator<<((ostream *)&cmCTestLog_msg,
                          "Only RUN_SERIAL tests remain, awaiting available slot.");
          pcVar1 = this->CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                       ,0x198,local_240._M_dataplus._M_p,false);
        }
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
        poVar10 = std::operator<<((ostream *)&cmCTestLog_msg,"*****");
        std::endl<char,std::char_traits<char>>(poVar10);
        pcVar1 = this->CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestMultiProcessHandler.cxx"
                     ,0x1a2,local_240._M_dataplus._M_p,false);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
        uVar4 = cmSystemTools::RandomSeed();
        uVar2 = this->FakeLoadForTesting;
        puVar5 = ::cm::uv_handle_ptr_base_<uv_timer_s>::get
                           ((uv_handle_ptr_base_<uv_timer_s> *)local_218);
        if (puVar5 == (uv_timer_s *)0x0) {
          ::cm::uv_timer_ptr::init(local_218,(EVP_PKEY_CTX *)&this->Loop);
        }
        timeout = 10;
        if (uVar2 == 0) {
          timeout = (ulong)((uVar4 % 5) * 1000 + 1000);
        }
        ::cm::uv_timer_ptr::start(local_218,OnTestLoadRetryCB,timeout,0);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&copy);
      cmsys::SystemInformation::~SystemInformation(&info);
      std::__cxx11::string::~string((string *)&testWithMinProcessors);
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::StartNextTests()
{
  if (this->TestLoadRetryTimer.get() != nullptr) {
    // This timer may be waiting to call StartNextTests again.
    // Since we have been called it is no longer needed.
    uv_timer_stop(this->TestLoadRetryTimer);
  }

  if (this->Tests.empty()) {
    this->TestLoadRetryTimer.reset();
    return;
  }

  if (this->CheckStopTimePassed()) {
    return;
  }

  size_t numToStart = 0;

  if (this->RunningCount < this->ParallelLevel) {
    numToStart = this->ParallelLevel - this->RunningCount;
  }

  if (numToStart == 0) {
    return;
  }

  // Don't start any new tests if one with the RUN_SERIAL property
  // is already running.
  if (this->SerialTestRunning) {
    return;
  }

  bool allTestsFailedTestLoadCheck = false;
  size_t minProcessorsRequired = this->ParallelLevel;
  std::string testWithMinProcessors;

  cmsys::SystemInformation info;

  unsigned long systemLoad = 0;
  size_t spareLoad = 0;
  if (this->TestLoad > 0) {
    // Activate possible wait.
    allTestsFailedTestLoadCheck = true;

    // Check for a fake load average value used in testing.
    if (this->FakeLoadForTesting > 0) {
      systemLoad = this->FakeLoadForTesting;
      // Drop the fake load for the next iteration to a value low enough
      // that the next iteration will start tests.
      this->FakeLoadForTesting = 1;
    }
    // If it's not set, look up the true load average.
    else {
      systemLoad = static_cast<unsigned long>(ceil(info.GetLoadAverage()));
    }
    spareLoad =
      (this->TestLoad > systemLoad ? this->TestLoad - systemLoad : 0);

    // Don't start more tests than the spare load can support.
    if (numToStart > spareLoad) {
      numToStart = spareLoad;
    }
  }

  TestList copy = this->SortedTests;
  for (auto const& test : copy) {
    // Take a nap if we're currently performing a RUN_SERIAL test.
    if (this->SerialTestRunning) {
      break;
    }
    // We can only start a RUN_SERIAL test if no other tests are also running.
    if (this->Properties[test]->RunSerial && this->RunningCount > 0) {
      continue;
    }

    size_t processors = GetProcessorsUsed(test);
    bool testLoadOk = true;
    if (this->TestLoad > 0) {
      if (processors <= spareLoad) {
        cmCTestLog(this->CTest, DEBUG,
                   "OK to run " << GetName(test) << ", it requires "
                                << processors << " procs & system load is: "
                                << systemLoad << std::endl);
        allTestsFailedTestLoadCheck = false;
      } else {
        testLoadOk = false;
      }
    }

    if (processors <= minProcessorsRequired) {
      minProcessorsRequired = processors;
      testWithMinProcessors = GetName(test);
    }

    if (testLoadOk && processors <= numToStart && this->StartTest(test)) {
      numToStart -= processors;
    } else if (numToStart == 0) {
      break;
    }
  }

  if (allTestsFailedTestLoadCheck) {
    // Find out whether there are any non RUN_SERIAL tests left, so that the
    // correct warning may be displayed.
    bool onlyRunSerialTestsLeft = true;
    for (auto const& test : copy) {
      if (!this->Properties[test]->RunSerial) {
        onlyRunSerialTestsLeft = false;
      }
    }
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "***** WAITING, ");

    if (this->SerialTestRunning) {
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "Waiting for RUN_SERIAL test to finish.");
    } else if (onlyRunSerialTestsLeft) {
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "Only RUN_SERIAL tests remain, awaiting available slot.");
    } else {
      /* clang-format off */
      cmCTestLog(this->CTest, HANDLER_OUTPUT,
                 "System Load: " << systemLoad << ", "
                 "Max Allowed Load: " << this->TestLoad << ", "
                 "Smallest test " << testWithMinProcessors <<
                 " requires " << minProcessorsRequired);
      /* clang-format on */
    }
    cmCTestLog(this->CTest, HANDLER_OUTPUT, "*****" << std::endl);

    // Wait between 1 and 5 seconds before trying again.
    unsigned int milliseconds = (cmSystemTools::RandomSeed() % 5 + 1) * 1000;
    if (this->FakeLoadForTesting) {
      milliseconds = 10;
    }
    if (this->TestLoadRetryTimer.get() == nullptr) {
      this->TestLoadRetryTimer.init(this->Loop, this);
    }
    this->TestLoadRetryTimer.start(
      &cmCTestMultiProcessHandler::OnTestLoadRetryCB, milliseconds, 0);
  }
}